

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_cpio_odc.c
# Opt level: O2

int format_octal(int64_t v,char *p,int s)

{
  int iVar1;
  int len;
  char *pcVar2;
  
  if (v < 0) {
    iVar1 = -1;
    for (; 0 < s; s = s + -1) {
      *p = '0';
      p = p + 1;
    }
  }
  else {
    pcVar2 = p + s;
    for (iVar1 = s; 0 < iVar1; iVar1 = iVar1 + -1) {
      pcVar2[-1] = (byte)v & 7 | 0x30;
      pcVar2 = pcVar2 + -1;
      v = (ulong)v >> 3;
    }
    if (v == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = -1;
      for (; 0 < s; s = s + -1) {
        *pcVar2 = '7';
        pcVar2 = pcVar2 + 1;
      }
    }
  }
  return iVar1;
}

Assistant:

static int
format_octal(int64_t v, void *p, int digits)
{
	int64_t	max;
	int	ret;

	max = (((int64_t)1) << (digits * 3)) - 1;
	if (v >= 0  &&  v <= max) {
	    format_octal_recursive(v, (char *)p, digits);
	    ret = 0;
	} else {
	    format_octal_recursive(max, (char *)p, digits);
	    ret = -1;
	}
	return (ret);
}